

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::require_extension_internal(CompilerGLSL *this,string *ext)

{
  bool bVar1;
  
  if ((this->backend).supports_extensions == true) {
    bVar1 = has_extension(this,ext);
    if (!bVar1) {
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&this->forced_extensions,ext);
      Compiler::force_recompile(&this->super_Compiler);
      return;
    }
  }
  return;
}

Assistant:

void CompilerGLSL::require_extension_internal(const string &ext)
{
	if (backend.supports_extensions && !has_extension(ext))
	{
		forced_extensions.push_back(ext);
		force_recompile();
	}
}